

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O3

void LogWithLevels(int v,int severity,bool err,bool alsoerr)

{
  bool bVar1;
  ostream *poVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  SendMethod send_method;
  FlagSaver saver;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  LogMessage local_48;
  code *local_38;
  undefined8 uStack_30;
  FlagSaver local_28;
  
  send_method = (SendMethod)(uint)severity;
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x171,"Test: v=%d stderrthreshold=%d logtostderr=%d alsologtostderr=%d",
                   (ulong)(uint)v,send_method,
                   CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                            (int)CONCAT71(in_register_00000011,err)),
                   CONCAT44((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                            (int)CONCAT71(in_register_00000009,alsoerr)));
  google::FlagSaver::FlagSaver(&local_28);
  fLI::FLAGS_stderrthreshold = severity;
  fLB::FLAGS_logtostderr = err;
  fLB::FLAGS_alsologtostderr = alsoerr;
  fLI::FLAGS_v = v;
  if ((-2 < *LogWithLevels::vlocal__) &&
     ((LogWithLevels::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,-1), bVar1)))) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x17a,"vlog -1");
  }
  if ((-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,0), bVar1)))) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x17b,"vlog 0");
  }
  if ((0 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,1), bVar1)))) {
    google::RawLog__(0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                     ,0x17c,"vlog 1");
  }
  google::RawLog__(0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x17d,"log info");
  google::RawLog__(1,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x17e,"log warning");
  google::RawLog__(2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                   ,0x17f,"log error");
  if ((-2 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,-1), bVar1)))) {
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x181);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog -1",7);
    google::LogMessage::~LogMessage(&local_48);
  }
  if ((-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,0), bVar1)))) {
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x182);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog 0",6);
    google::LogMessage::~LogMessage(&local_48);
  }
  if ((0 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,1), bVar1)))) {
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x183);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog 1",6);
    google::LogMessage::~LogMessage(&local_48);
  }
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x184);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log info",8);
  google::LogMessage::~LogMessage(&local_48);
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x185,1);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log warning",0xb);
  google::LogMessage::~LogMessage(&local_48);
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x186,2);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log error",9);
  google::LogMessage::~LogMessage(&local_48);
  if ((-2 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,-1), bVar1)))) {
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x188);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog_if -1",10);
    google::LogMessage::~LogMessage(&local_48);
  }
  if ((-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,0), bVar1)))) {
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x18a);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog_if 0",9);
    google::LogMessage::~LogMessage(&local_48);
  }
  if ((0 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,1), bVar1)))) {
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x18c);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog_if 1",9);
    google::LogMessage::~LogMessage(&local_48);
  }
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x18e);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log_if info",0xb);
  google::LogMessage::~LogMessage(&local_48);
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,400,1);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log_if warning",0xe);
  google::LogMessage::~LogMessage(&local_48);
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x192,2);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log_if error",0xc);
  google::LogMessage::~LogMessage(&local_48);
  if ((99 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,100), bVar1)))) {
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x196);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog_if 100 expr",0x10);
    google::LogMessage::~LogMessage(&local_48);
  }
  if ((-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,0), bVar1)))) {
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x197);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog_if 0 expr",0xe);
    google::LogMessage::~LogMessage(&local_48);
  }
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x198);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log_if info expr",0x10);
  google::LogMessage::~LogMessage(&local_48);
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x199,2);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log_if error expr",0x11);
  google::LogMessage::~LogMessage(&local_48);
  LogWithLevels::occurrences_413 = LogWithLevels::occurrences_413 + 1;
  local_38 = google::LogMessage::SendToLog;
  uStack_30 = 0;
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x19d,0,LogWithLevels::occurrences_413,send_method);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log_if info every 1 expr",0x18);
  google::LogMessage::~LogMessage(&local_48);
  LogWithLevels::occurrences_415 = LogWithLevels::occurrences_415 + 1;
  local_38 = google::LogMessage::SendToLog;
  uStack_30 = 0;
  google::LogMessage::LogMessage
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
             ,0x19f,2,LogWithLevels::occurrences_415,send_method);
  poVar2 = google::LogMessage::stream(&local_48);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"log_if error every 1 expr",0x19);
  google::LogMessage::~LogMessage(&local_48);
  LogWithLevels::occurrences_417 = LogWithLevels::occurrences_417 + 1;
  LogWithLevels::occurrences_419 = LogWithLevels::occurrences_419 + 1;
  LogWithLevels::occurrences_421 = LogWithLevels::occurrences_421 + 1;
  if ((-1 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     ((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
      (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                   ,0), bVar1)))) {
    local_38 = google::LogMessage::SendToLog;
    uStack_30 = 0;
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x1a5,0,LogWithLevels::occurrences_421,send_method);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog_if 0 every 1 expr",0x16);
    google::LogMessage::~LogMessage(&local_48);
  }
  LogWithLevels::occurrences_423 = LogWithLevels::occurrences_423 + 1;
  if ((99 < *LogWithLevels(int,int,bool,bool)::vlocal__) &&
     (((LogWithLevels(int,int,bool,bool)::vlocal__ != &google::kLogSiteUninitialized ||
       (bVar1 = google::InitVLOG3__(&LogWithLevels(int,int,bool,bool)::vlocal__,&fLI::FLAGS_v,
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
                                    ,100), bVar1)) &&
      (LogWithLevels::occurrences_mod_n_423 =
            LogWithLevels::occurrences_mod_n_423 +
            ((LogWithLevels::occurrences_mod_n_423 + 1U) / 3) * -3 + 1,
      LogWithLevels::occurrences_mod_n_423 == 1)))) {
    local_38 = google::LogMessage::SendToLog;
    uStack_30 = 0;
    google::LogMessage::LogMessage
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging_unittest.cc"
               ,0x1a7,0,LogWithLevels::occurrences_423,send_method);
    poVar2 = google::LogMessage::stream(&local_48);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"vlog_if 100 every 3 expr",0x18);
    google::LogMessage::~LogMessage(&local_48);
  }
  LogWithLevels::occurrences_425 = LogWithLevels::occurrences_425 + 1;
  LogWithLevels::occurrences_427 = LogWithLevels::occurrences_427 + 1;
  google::FlagSaver::~FlagSaver(&local_28);
  return;
}

Assistant:

void LogWithLevels(int v, int severity, bool err, bool alsoerr) {
  RAW_LOG(INFO,
          "Test: v=%d stderrthreshold=%d logtostderr=%d alsologtostderr=%d",
          v, severity, err, alsoerr);

  FlagSaver saver;

  FLAGS_v = v;
  FLAGS_stderrthreshold = severity;
  FLAGS_logtostderr = err;
  FLAGS_alsologtostderr = alsoerr;

  RAW_VLOG(-1, "vlog -1");
  RAW_VLOG(0, "vlog 0");
  RAW_VLOG(1, "vlog 1");
  RAW_LOG(INFO, "log info");
  RAW_LOG(WARNING, "log warning");
  RAW_LOG(ERROR, "log error");

  VLOG(-1) << "vlog -1";
  VLOG(0) << "vlog 0";
  VLOG(1) << "vlog 1";
  LOG(INFO) << "log info";
  LOG(WARNING) << "log warning";
  LOG(ERROR) << "log error";

  VLOG_IF(-1, true) << "vlog_if -1";
  VLOG_IF(-1, false) << "don't vlog_if -1";
  VLOG_IF(0, true) << "vlog_if 0";
  VLOG_IF(0, false) << "don't vlog_if 0";
  VLOG_IF(1, true) << "vlog_if 1";
  VLOG_IF(1, false) << "don't vlog_if 1";
  LOG_IF(INFO, true) << "log_if info";
  LOG_IF(INFO, false) << "don't log_if info";
  LOG_IF(WARNING, true) << "log_if warning";
  LOG_IF(WARNING, false) << "don't log_if warning";
  LOG_IF(ERROR, true) << "log_if error";
  LOG_IF(ERROR, false) << "don't log_if error";

  int c;
  c = 1; VLOG_IF(100, c -= 2) << "vlog_if 100 expr"; EXPECT_EQ(c, -1);
  c = 1; VLOG_IF(0, c -= 2) << "vlog_if 0 expr"; EXPECT_EQ(c, -1);
  c = 1; LOG_IF(INFO, c -= 2) << "log_if info expr"; EXPECT_EQ(c, -1);
  c = 1; LOG_IF(ERROR, c -= 2) << "log_if error expr"; EXPECT_EQ(c, -1);
  c = 2; VLOG_IF(0, c -= 2) << "don't vlog_if 0 expr"; EXPECT_EQ(c, 0);
  c = 2; LOG_IF(ERROR, c -= 2) << "don't log_if error expr"; EXPECT_EQ(c, 0);

  c = 3; LOG_IF_EVERY_N(INFO, c -= 4, 1) << "log_if info every 1 expr";
  EXPECT_EQ(c, -1);
  c = 3; LOG_IF_EVERY_N(ERROR, c -= 4, 1) << "log_if error every 1 expr";
  EXPECT_EQ(c, -1);
  c = 4; LOG_IF_EVERY_N(ERROR, c -= 4, 3) << "don't log_if info every 3 expr";
  EXPECT_EQ(c, 0);
  c = 4; LOG_IF_EVERY_N(ERROR, c -= 4, 3) << "don't log_if error every 3 expr";
  EXPECT_EQ(c, 0);
  c = 5; VLOG_IF_EVERY_N(0, c -= 4, 1) << "vlog_if 0 every 1 expr";
  EXPECT_EQ(c, 1);
  c = 5; VLOG_IF_EVERY_N(100, c -= 4, 3) << "vlog_if 100 every 3 expr";
  EXPECT_EQ(c, 1);
  c = 6; VLOG_IF_EVERY_N(0, c -= 6, 1) << "don't vlog_if 0 every 1 expr";
  EXPECT_EQ(c, 0);
  c = 6; VLOG_IF_EVERY_N(100, c -= 6, 3) << "don't vlog_if 100 every 1 expr";
  EXPECT_EQ(c, 0);
}